

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

bool CB::test_label(void *v)

{
  size_t sVar1;
  cb_class *pcVar2;
  v_array<CB::cb_class> *in_RDI;
  size_t i;
  label *ld;
  ulong local_20;
  
  sVar1 = v_array<CB::cb_class>::size(in_RDI);
  if (sVar1 != 0) {
    for (local_20 = 0; sVar1 = v_array<CB::cb_class>::size(in_RDI), local_20 < sVar1;
        local_20 = local_20 + 1) {
      pcVar2 = v_array<CB::cb_class>::operator[](in_RDI,local_20);
      if (((pcVar2->cost != 3.4028235e+38) || (NAN(pcVar2->cost))) &&
         (pcVar2 = v_array<CB::cb_class>::operator[](in_RDI,local_20), 0.0 < pcVar2->probability)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool test_label(void* v)
{
  CB::label* ld = (CB::label*)v;
  if (ld->costs.size() == 0)
    return true;
  for (size_t i = 0; i < ld->costs.size(); i++)
    if (FLT_MAX != ld->costs[i].cost && ld->costs[i].probability > 0.)
      return false;
  return true;
}